

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVGPainter.cpp
# Opt level: O1

void __thiscall
SVGChart::SVGPainter::DrawLine(SVGPainter *this,float inX1,float inY1,float inX2,float inY2)

{
  undefined1 *this_00;
  ostream *poVar1;
  
  this_00 = &this->field_0x38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<line x1=\"",10);
  poVar1 = std::ostream::_M_insert<double>((double)inX1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" y1=\"",6);
  std::ostream::_M_insert<double>((double)inY1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\" x2=\"",6);
  poVar1 = std::ostream::_M_insert<double>((double)inX2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" y2=\"",6);
  std::ostream::_M_insert<double>((double)inY2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\" stroke=\"",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"rgb(",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->lineRed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->lineGreen);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lineBlue);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" />\n",5);
  return;
}

Assistant:

void SVGPainter::DrawLine (float inX1, float inY1, float inX2, float inY2) {
        svgContent << "<line x1=\"" << inX1 << "\" y1=\"" << inY1;
        svgContent << "\" x2=\"" << inX2 << "\" y2=\"" << inY2;
        svgContent << "\" stroke=\"" << "rgb(" << lineRed << ",";
        svgContent << lineGreen << "," << lineBlue << ")" << "\" />\n";
    }